

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteVFormatDTDAttlist
              (xmlTextWriterPtr writer,xmlChar *name,char *format,__va_list_tag *argptr)

{
  xmlChar *content;
  xmlChar *buf;
  int rc;
  __va_list_tag *argptr_local;
  char *format_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    writer_local._4_4_ = -1;
  }
  else {
    content = xmlTextWriterVSprintf(format,argptr);
    if (content == (xmlChar *)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = xmlTextWriterWriteDTDAttlist(writer,name,content);
      (*xmlFree)(content);
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteVFormatDTDAttlist(xmlTextWriterPtr writer,
                                    const xmlChar * name,
                                    const char *format, va_list argptr)
{
    int rc;
    xmlChar *buf;

    if (writer == NULL)
        return -1;

    buf = xmlTextWriterVSprintf(format, argptr);
    if (buf == NULL)
        return -1;

    rc = xmlTextWriterWriteDTDAttlist(writer, name, buf);

    xmlFree(buf);
    return rc;
}